

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void Cnf_DataWriteIntoFile
               (Cnf_Dat_t *p,char *pFileName,int fReadable,Vec_Int_t *vForAlls,Vec_Int_t *vExists)

{
  int **ppiVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  FILE *__s;
  int iVar8;
  long lVar9;
  uint *puVar10;
  
  sVar7 = strlen(pFileName);
  if (((pFileName[sVar7 - 3] == '.') && (pFileName[sVar7 - 2] == 'g')) &&
     (pFileName[sVar7 - 1] == 'z')) {
    Cnf_DataWriteIntoFileGz(p,pFileName,fReadable,vForAlls,vExists);
    return;
  }
  __s = fopen(pFileName,"w");
  if (__s == (FILE *)0x0) {
    puts("Cnf_WriteIntoFile(): Output file cannot be opened.");
    return;
  }
  fwrite("c Result of efficient AIG-to-CNF conversion using package CNF\n",0x3e,1,__s);
  fprintf(__s,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  if (vForAlls != (Vec_Int_t *)0x0) {
    fwrite("a ",2,1,__s);
    for (iVar8 = 0; iVar8 < vForAlls->nSize; iVar8 = iVar8 + 1) {
      iVar5 = Vec_IntEntry(vForAlls,iVar8);
      fprintf(__s,"%d ",(ulong)(iVar5 + (uint)(fReadable == 0)));
    }
    fwrite("0\n",2,1,__s);
  }
  if (vExists != (Vec_Int_t *)0x0) {
    fwrite("e ",2,1,__s);
    for (iVar8 = 0; iVar8 < vExists->nSize; iVar8 = iVar8 + 1) {
      iVar5 = Vec_IntEntry(vExists,iVar8);
      fprintf(__s,"%d ",(ulong)(iVar5 + (uint)(fReadable == 0)));
    }
    fwrite("0\n",2,1,__s);
  }
  lVar9 = 0;
  while (lVar9 < p->nClauses) {
    ppiVar1 = p->pClauses + lVar9;
    puVar3 = (uint *)p->pClauses[lVar9 + 1];
    lVar9 = lVar9 + 1;
    for (puVar10 = (uint *)*ppiVar1; puVar10 < puVar3; puVar10 = puVar10 + 1) {
      uVar2 = *puVar10;
      uVar6 = (int)uVar2 >> 1;
      if (fReadable == 0) {
        uVar4 = ~uVar6;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar6 + 1;
        }
      }
      else {
        uVar4 = -uVar6;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar6;
        }
      }
      fprintf(__s,"%d ",(ulong)uVar4);
    }
    fwrite("0\n",2,1,__s);
  }
  fputc(10,__s);
  fclose(__s);
  return;
}

Assistant:

void Cnf_DataWriteIntoFile( Cnf_Dat_t * p, char * pFileName, int fReadable, Vec_Int_t * vForAlls, Vec_Int_t * vExists )
{
    FILE * pFile;
    int * pLit, * pStop, i, VarId;
    if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) ) 
    {
        Cnf_DataWriteIntoFileGz( p, pFileName, fReadable, vForAlls, vExists );
        return;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cnf_WriteIntoFile(): Output file cannot be opened.\n" );
        return;
    }
    fprintf( pFile, "c Result of efficient AIG-to-CNF conversion using package CNF\n" );
    fprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    if ( vForAlls )
    {
        fprintf( pFile, "a " );
        Vec_IntForEachEntry( vForAlls, VarId, i )
            fprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        fprintf( pFile, "0\n" );
    }
    if ( vExists )
    {
        fprintf( pFile, "e " );
        Vec_IntForEachEntry( vExists, VarId, i )
            fprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        fprintf( pFile, "0\n" );
    }
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            fprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        fprintf( pFile, "0\n" );
    }
    fprintf( pFile, "\n" );
    fclose( pFile );
}